

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateZeroInitialize(ExpressionTranslateContext *ctx,ExprZeroInitialize *expression)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  char *format;
  
  pTVar1 = expression->address->type;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x4b3,
                  "void TranslateZeroInitialize(ExpressionTranslateContext &, ExprZeroInitialize *)"
                 );
  }
  pp_Var2 = pTVar1[1]._vptr_TypeBase;
  if (pp_Var2 == (_func_int **)0x0) {
switchD_00150127_caseD_c:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x4db,
                  "void TranslateZeroInitialize(ExpressionTranslateContext &, ExprZeroInitialize *)"
                 );
  }
  switch(*(undefined4 *)(pp_Var2 + 1)) {
  case 1:
    format = "0";
    break;
  case 2:
    Print(ctx,"*(");
    Translate(ctx,expression->address);
    format = ") = false";
    break;
  case 3:
  case 4:
  case 5:
  case 6:
  case 9:
  case 10:
  case 0xb:
  case 0x12:
    Print(ctx,"*(");
    Translate(ctx,expression->address);
    format = ") = 0";
    break;
  case 7:
    Print(ctx,"*(");
    Translate(ctx,expression->address);
    format = ") = 0.0f";
    break;
  case 8:
    Print(ctx,"*(");
    Translate(ctx,expression->address);
    format = ") = 0.0";
    break;
  default:
    goto switchD_00150127_caseD_c;
  case 0x10:
  case 0x11:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x18:
  case 0x19:
    Print(ctx,"memset(");
    Translate(ctx,expression->address);
    Print(ctx,", 0, %d)",(ulong)*(uint *)(pp_Var2 + 6));
    return;
  }
  Print(ctx,format);
  return;
}

Assistant:

void TranslateZeroInitialize(ExpressionTranslateContext &ctx, ExprZeroInitialize *expression)
{
	TypeRef *refType = getType<TypeRef>(expression->address->type);

	assert(refType);

	TypeBase *type = refType->subType;

	if(isType<TypeVoid>(type))
	{
		Print(ctx, "0");
	}
	else if(isType<TypeBool>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = false");
	}
	else if(isType<TypeChar>(type) || isType<TypeShort>(type) || isType<TypeInt>(type) || isType<TypeLong>(type) || isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeNullptr>(type) || isType<TypeRef>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = 0");
	}
	else if(isType<TypeFloat>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = 0.0f");
	}
	else if(isType<TypeDouble>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = 0.0");
	}
	else if(isType<TypeAutoRef>(type) || isType<TypeAutoArray>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeClass>(type) || isType<TypeEnum>(type))
	{
		Print(ctx, "memset(");
		Translate(ctx, expression->address);
		Print(ctx, ", 0, %d)", unsigned(type->size));
	}
	else
	{
		assert(!"unknown type");
	}
}